

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)0>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GridLocalPolynomial *this
          ,double tolerance,TypeRefinement criteria,int output,
          vector<int,_std::allocator<int>_> *level_limits,double *scale_correction)

{
  double dVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  Data2D<int> *pDVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  pointer pSVar7;
  size_t __n;
  double *pdVar8;
  reference pvVar9;
  pointer pDVar10;
  int *piVar11;
  int *piVar12;
  reference piVar13;
  reference pvVar14;
  anon_class_16_2_32987795 apply;
  int local_448;
  int local_434;
  int local_38c;
  allocator<double> local_369;
  double local_368;
  iterator local_360;
  size_type local_358;
  NodeData local_350;
  int local_320;
  undefined1 local_31a;
  allocator<double> local_319;
  int i_4;
  iterator local_310;
  size_type local_308;
  NodeData local_300;
  int local_2cc;
  int i_3;
  forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> weighted_points;
  vector<int,_std::allocator<int>_> initial_levels;
  allocator<int> local_299;
  vector<int,_std::allocator<int>_> local_298;
  int local_280;
  int local_27c;
  int idx;
  int i_2;
  double correction_1;
  undefined1 local_268 [8];
  reverse_iterator is_1;
  double max_weight;
  vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> split_1;
  vector<int,_std::allocator<int>_> rlevels_1;
  int ip;
  int r;
  int *p_1;
  iterator __end5;
  iterator __begin5;
  vector<int,_std::allocator<int>_> *__range5;
  double correction;
  undefined1 local_1e8 [8];
  vector<int,_std::allocator<int>_> parent;
  undefined1 local_1c8 [4];
  int i_1;
  undefined1 local_1c0 [8];
  reverse_iterator is;
  vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> split;
  vector<int,_std::allocator<int>_> rlevels;
  undefined1 local_178 [8];
  vector<int,_std::allocator<int>_> p;
  double weight;
  int i;
  vector<double,_std::allocator<double>_> refine_weights;
  anon_class_32_4_cc64a04a getDominantSurplus;
  allocator<double> local_101;
  value_type_conflict2 local_100;
  vector<double,_std::allocator<double>_> local_f8;
  undefined1 local_e0 [8];
  vector<double,_std::allocator<double>_> default_scale;
  Wrapper2D<const_double> scale;
  undefined1 local_b0 [4];
  int active_outputs;
  vector<double,_std::allocator<double>_> norm;
  undefined1 local_88 [8];
  MultiIndexSet new_points;
  MultiIndexSet refine_candidates;
  double *scale_correction_local;
  vector<int,_std::allocator<int>_> *level_limits_local;
  int output_local;
  TypeRefinement criteria_local;
  double tolerance_local;
  GridLocalPolynomial *this_local;
  
  level_limits_local._0_4_ = output;
  level_limits_local._4_4_ = criteria;
  _output_local = (double *)tolerance;
  tolerance_local = (double)this;
  this_local = (GridLocalPolynomial *)__return_storage_ptr__;
  getRefinementCanidates<(TasGrid::RuleLocal::erule)0>
            ((MultiIndexSet *)
             &new_points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this,tolerance,criteria,output,level_limits,
             scale_correction);
  pSVar7 = ::std::
           unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
           ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                         *)&this->dynamic_values);
  bVar4 = MultiIndexSet::empty(&pSVar7->initial_points);
  if (bVar4) {
    MultiIndexSet::MultiIndexSet
              ((MultiIndexSet *)local_88,
               (MultiIndexSet *)
               &new_points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    pSVar7 = ::std::
             unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                           *)&this->dynamic_values);
    MultiIndexSet::operator-
              ((MultiIndexSet *)local_88,
               (MultiIndexSet *)
               &new_points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&pSVar7->initial_points);
  }
  getNormalization((vector<double,_std::allocator<double>_> *)local_b0,this);
  if ((int)level_limits_local == -1) {
    local_38c = (this->super_BaseCanonicalGrid).num_outputs;
  }
  else {
    local_38c = 1;
  }
  Utils::Wrapper2D<const_double>::Wrapper2D
            ((Wrapper2D<const_double> *)
             &default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_38c,scale_correction);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_e0);
  if (scale_correction == (double *)0x0) {
    iVar5 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
    __n = Utils::size_mult<int,int>(local_38c,iVar5);
    local_100 = 1.0;
    ::std::allocator<double>::allocator(&local_101);
    ::std::vector<double,_std::allocator<double>_>::vector(&local_f8,__n,&local_100,&local_101);
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_e0,&local_f8);
    ::std::vector<double,_std::allocator<double>_>::~vector(&local_f8);
    ::std::allocator<double>::~allocator(&local_101);
    pdVar8 = ::std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)local_e0);
    Utils::Wrapper2D<const_double>::Wrapper2D
              ((Wrapper2D<const_double> *)&getDominantSurplus.norm,local_38c,pdVar8);
    default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)getDominantSurplus.norm;
    Utils::Wrapper2D<const_double>::~Wrapper2D((Wrapper2D<const_double> *)&getDominantSurplus.norm);
  }
  getDominantSurplus.this =
       (GridLocalPolynomial *)
       &default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  getDominantSurplus.scale = (Wrapper2D<const_double> *)&level_limits_local;
  getDominantSurplus.output = (int *)local_b0;
  refine_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)this;
  iVar5 = MultiIndexSet::getNumIndexes((MultiIndexSet *)local_88);
  ::std::allocator<double>::allocator((allocator<double> *)((long)&weight + 7));
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i,(long)iVar5,
             (allocator<double> *)((long)&weight + 7));
  ::std::allocator<double>::~allocator((allocator<double> *)((long)&weight + 7));
  for (weight._0_4_ = 0; iVar5 = weight._0_4_,
      iVar6 = MultiIndexSet::getNumIndexes((MultiIndexSet *)local_88), iVar5 < iVar6;
      weight._0_4_ = weight._0_4_ + 1) {
    p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    MultiIndexSet::copyIndex
              ((vector<int,_std::allocator<int>_> *)local_178,(MultiIndexSet *)local_88,weight._0_4_
              );
    apply.getDominantSurplus = (anon_class_32_4_cc64a04a *)level_limits;
    apply.weight = (double *)
                   &refine_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
    HierarchyManipulations::
    touchAllImmediateRelatives<(TasGrid::RuleLocal::erule)0,TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)0>(double,TasGrid::TypeRefinement,int,std::vector<int,std::allocator<int>>const&,double_const*)::_lambda(int)_2_>
              ((HierarchyManipulations *)local_178,
               (vector<int,_std::allocator<int>_> *)&(this->super_BaseCanonicalGrid).points,
               (MultiIndexSet *)
               &p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,apply);
    piVar3 = p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,(long)weight._0_4_);
    *pvVar9 = (value_type)piVar3;
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)local_178);
  }
  bVar4 = MultiIndexSet::empty((MultiIndexSet *)local_88);
  if ((bVar4) ||
     ((level_limits_local._4_4_ != refine_parents_first && (level_limits_local._4_4_ != refine_fds))
     )) {
    bVar4 = MultiIndexSet::empty((MultiIndexSet *)local_88);
    if ((!bVar4) && (level_limits_local._4_4_ == refine_stable)) {
      HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)0>
                ((vector<int,_std::allocator<int>_> *)
                 &split_1.
                  super__Vector_base<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(MultiIndexSet *)local_88);
      HierarchyManipulations::splitByLevels
                ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)&max_weight
                 ,(MultiIndexSet *)local_88,
                 (vector<int,_std::allocator<int>_> *)
                 &split_1.
                  super__Vector_base<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      is_1.current._M_current =
           (__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>
            )(Data2D<int> *)0x0;
      ::std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>::rbegin
                ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)local_268);
      while( true ) {
        ::std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>::rend
                  ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)
                   &correction_1);
        bVar4 = ::std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                                   *)local_268,
                                  (reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                                   *)&correction_1);
        if (!bVar4) break;
        _idx = is_1.current._M_current;
        local_27c = 0;
        while( true ) {
          iVar5 = local_27c;
          pDVar10 = ::std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                                  *)local_268);
          iVar6 = Data2D<int>::getNumStrips(pDVar10);
          if (iVar6 <= iVar5) break;
          pDVar10 = ::std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                                  *)local_268);
          piVar11 = Data2D<int>::getStrip(pDVar10,local_27c);
          pDVar10 = ::std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                                  *)local_268);
          piVar12 = Data2D<int>::getStrip(pDVar10,local_27c);
          iVar5 = (this->super_BaseCanonicalGrid).num_dimensions;
          ::std::allocator<int>::allocator(&local_299);
          ::std::vector<int,std::allocator<int>>::vector<int*,void>
                    ((vector<int,std::allocator<int>> *)&local_298,piVar11,piVar12 + iVar5,
                     &local_299);
          iVar5 = MultiIndexSet::getSlot((MultiIndexSet *)local_88,&local_298);
          ::std::vector<int,_std::allocator<int>_>::~vector(&local_298);
          ::std::allocator<int>::~allocator(&local_299);
          pDVar2 = _idx;
          local_280 = iVar5;
          pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&i,(long)iVar5);
          *pvVar9 = (double)pDVar2 + *pvVar9;
          pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&i,(long)local_280);
          pdVar8 = ::std::max<double>((double *)&is_1,pvVar9);
          is_1.current._M_current =
               (__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>
                )*pdVar8;
          local_27c = local_27c + 1;
        }
        ::std::
        reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                      *)&initial_levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(int)local_268);
      }
      ::std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>::~vector
                ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)&max_weight
                );
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &split_1.
                  super__Vector_base<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)0>
              ((vector<int,_std::allocator<int>_> *)
               &split.
                super__Vector_base<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(MultiIndexSet *)local_88);
    HierarchyManipulations::splitByLevels
              ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)&is,
               (MultiIndexSet *)local_88,
               (vector<int,_std::allocator<int>_> *)
               &split.
                super__Vector_base<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>::rbegin
              ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)local_1c0);
    while( true ) {
      ::std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>::rend
                ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)local_1c8);
      bVar4 = ::std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                                 *)local_1c0,
                                (reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                                 *)local_1c8);
      if (!bVar4) break;
      parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      while( true ) {
        iVar5 = parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage._4_4_;
        pDVar10 = ::std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                                *)local_1c0);
        iVar6 = Data2D<int>::getNumStrips(pDVar10);
        if (iVar6 <= iVar5) break;
        pDVar10 = ::std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                                *)local_1c0);
        piVar11 = Data2D<int>::getStrip
                            (pDVar10,parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_);
        pDVar10 = ::std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                                *)local_1c0);
        piVar12 = Data2D<int>::getStrip
                            (pDVar10,parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_);
        iVar5 = (this->super_BaseCanonicalGrid).num_dimensions;
        ::std::allocator<int>::allocator((allocator<int> *)((long)&correction + 7));
        ::std::vector<int,std::allocator<int>>::vector<int*,void>
                  ((vector<int,std::allocator<int>> *)local_1e8,piVar11,piVar12 + iVar5,
                   (allocator<int> *)((long)&correction + 7));
        ::std::allocator<int>::~allocator((allocator<int> *)((long)&correction + 7));
        iVar5 = MultiIndexSet::getSlot
                          ((MultiIndexSet *)local_88,(vector<int,_std::allocator<int>_> *)local_1e8)
        ;
        pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&i,(long)iVar5);
        dVar1 = *pvVar9;
        __end5._M_current =
             (int *)::std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)local_1e8);
        p_1 = (int *)::std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_1e8);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           *)&p_1), bVar4) {
          piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end5);
          iVar5 = *piVar13;
          iVar6 = RuleLocal::getParent<(TasGrid::RuleLocal::erule)0>(iVar5);
          *piVar13 = iVar6;
          if (*piVar13 == -1) {
            local_434 = -1;
          }
          else {
            local_434 = MultiIndexSet::getSlot
                                  ((MultiIndexSet *)local_88,
                                   (vector<int,_std::allocator<int>_> *)local_1e8);
          }
          if (local_434 != -1) {
            pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&i,(long)local_434);
            *pvVar9 = dVar1 + *pvVar9;
          }
          iVar6 = RuleLocal::getStepParent<(TasGrid::RuleLocal::erule)0>(iVar5);
          *piVar13 = iVar6;
          if (*piVar13 == -1) {
            local_448 = -1;
          }
          else {
            local_448 = MultiIndexSet::getSlot
                                  ((MultiIndexSet *)local_88,
                                   (vector<int,_std::allocator<int>_> *)local_1e8);
          }
          if (local_448 != -1) {
            pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&i,(long)local_448);
            *pvVar9 = dVar1 + *pvVar9;
          }
          *piVar13 = iVar5;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end5);
        }
        ::std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_1e8);
        parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             parent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1;
      }
      ::std::
      reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<TasGrid::Data2D<int>_*,_std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>_>_>
                    *)&rlevels_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(int)local_1c0);
    }
    ::std::vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>::~vector
              ((vector<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_> *)&is);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &split.
                super__Vector_base<TasGrid::Data2D<int>,_std::allocator<TasGrid::Data2D<int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pSVar7 = ::std::
           unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
           ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                         *)&this->dynamic_values);
  HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)0>
            ((vector<int,_std::allocator<int>_> *)&weighted_points,&pSVar7->initial_points);
  ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::forward_list
            ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
             &stack0xfffffffffffffd38);
  local_2cc = 0;
  while( true ) {
    iVar5 = local_2cc;
    pSVar7 = ::std::
             unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                           *)&this->dynamic_values);
    iVar6 = MultiIndexSet::getNumIndexes(&pSVar7->initial_points);
    if (iVar6 <= iVar5) break;
    pSVar7 = ::std::
             unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                           *)&this->dynamic_values);
    MultiIndexSet::copyIndex(&local_300.point,&pSVar7->initial_points,local_2cc);
    local_31a = 1;
    pvVar14 = ::std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&weighted_points,(long)local_2cc);
    _i_4 = -1.0 / (double)*pvVar14;
    local_310 = (iterator)&i_4;
    local_308 = 1;
    ::std::allocator<double>::allocator(&local_319);
    __l_00._M_len = local_308;
    __l_00._M_array = local_310;
    ::std::vector<double,_std::allocator<double>_>::vector(&local_300.value,__l_00,&local_319);
    local_31a = 0;
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::push_front
              ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
               &stack0xfffffffffffffd38,&local_300);
    NodeData::~NodeData(&local_300);
    ::std::allocator<double>::~allocator(&local_319);
    local_2cc = local_2cc + 1;
  }
  for (local_320 = 0; iVar5 = local_320,
      iVar6 = MultiIndexSet::getNumIndexes((MultiIndexSet *)local_88), iVar5 < iVar6;
      local_320 = local_320 + 1) {
    MultiIndexSet::copyIndex(&local_350.point,(MultiIndexSet *)local_88,local_320);
    pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,(long)local_320);
    local_368 = 1.0 / *pvVar9;
    local_360 = &local_368;
    local_358 = 1;
    ::std::allocator<double>::allocator(&local_369);
    __l._M_len = local_358;
    __l._M_array = local_360;
    ::std::vector<double,_std::allocator<double>_>::vector(&local_350.value,__l,&local_369);
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::push_front
              ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
               &stack0xfffffffffffffd38,&local_350);
    NodeData::~NodeData(&local_350);
    ::std::allocator<double>::~allocator(&local_369);
  }
  ::std::forward_list<TasGrid::NodeData,std::allocator<TasGrid::NodeData>>::
  sort<TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)0>(double,TasGrid::TypeRefinement,int,std::vector<int,std::allocator<int>>const&,double_const*)::_lambda(TasGrid::NodeData_const&,TasGrid::NodeData_const&)_1_>
            ((forward_list<TasGrid::NodeData,std::allocator<TasGrid::NodeData>> *)
             &stack0xfffffffffffffd38);
  listToLocalNodes<TasGrid::GridLocalPolynomial::getCandidateConstructionPoints<(TasGrid::RuleLocal::erule)0>(double,TasGrid::TypeRefinement,int,std::vector<int,std::allocator<int>>const&,double_const*)::_lambda(int)_3_>
            (__return_storage_ptr__,(TasGrid *)&stack0xfffffffffffffd38,
             (long)(this->super_BaseCanonicalGrid).num_dimensions);
  ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::~forward_list
            ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
             &stack0xfffffffffffffd38);
  ::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&weighted_points);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_e0);
  Utils::Wrapper2D<const_double>::~Wrapper2D
            ((Wrapper2D<const_double> *)
             &default_scale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_b0);
  MultiIndexSet::~MultiIndexSet((MultiIndexSet *)local_88);
  MultiIndexSet::~MultiIndexSet
            ((MultiIndexSet *)
             &new_points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> GridLocalPolynomial::getCandidateConstructionPoints(double tolerance, TypeRefinement criteria, int output,
                                                                        std::vector<int> const &level_limits, double const *scale_correction){
    // combine the initial points with negative weights and the refinement candidates with surplus weights (no need to normalize, the sort uses relative values)
    MultiIndexSet refine_candidates = getRefinementCanidates<effrule>(tolerance, criteria, output, level_limits, scale_correction);
    MultiIndexSet new_points = (dynamic_values->initial_points.empty()) ? std::move(refine_candidates) : refine_candidates - dynamic_values->initial_points;

    // compute the weights for the new_points points
    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){ // if no scale provided, assume default 1.0
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, points.getNumIndexes()), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    auto getDominantSurplus = [&](int i)-> double{
        double dominant = 0.0;
        const double *s = surpluses.getStrip(i);
        const double *c = scale.getStrip(i);
        if (output == -1){
            for(int k=0; k<num_outputs; k++) dominant = std::max(dominant, c[k] * std::abs(s[k]) / norm[k]);
        }else{
            dominant = c[0] * std::abs(s[output]) / norm[output];
        }
        return dominant;
    };

    std::vector<double> refine_weights(new_points.getNumIndexes());

    #pragma omp parallel for
    for(int i=0; i<new_points.getNumIndexes(); i++){
        double weight = 0.0;
        std::vector<int> p = new_points.copyIndex(i);

        HierarchyManipulations::touchAllImmediateRelatives<effrule>(p, points,
                [&](int relative)->void{ weight = std::max(weight, getDominantSurplus(relative)); });
        refine_weights[i] = weight; // those will be inverted
    }

    // if using stable refinement, ensure the weight of the parents is never less than the children
    if (!new_points.empty() && ((criteria == refine_parents_first) || (criteria == refine_fds))){
        auto rlevels = HierarchyManipulations::computeLevels<effrule>(new_points);
        auto split = HierarchyManipulations::splitByLevels(new_points, rlevels);
        for(auto is = split.rbegin(); is != split.rend(); is++){
            for(int i=0; i<is->getNumStrips(); i++){
                std::vector<int> parent(is->getStrip(i), is->getStrip(i) + num_dimensions);
                double correction = refine_weights[new_points.getSlot(parent)]; // will never be missing
                for(auto &p : parent){
                    int r = p;
                    p = RuleLocal::getParent<effrule>(r);
                    int ip = (p == -1) ? -1 : new_points.getSlot(parent); // if parent is among the refined
                    if (ip != -1) refine_weights[ip] += correction;
                    p = RuleLocal::getStepParent<effrule>(r);
                    ip = (p == -1) ? -1 : new_points.getSlot(parent); // if parent is among the refined
                    if (ip != -1) refine_weights[ip] += correction;
                    p = r;
                }
            }
        }
    }else if (!new_points.empty() && (criteria == refine_stable)){
        // stable refinement, ensure that if level[i] < level[j] then weight[i] > weight[j]
        auto rlevels = HierarchyManipulations::computeLevels<effrule>(new_points);
        auto split = HierarchyManipulations::splitByLevels(new_points, rlevels);
        double max_weight = 0.0;
        for(auto is = split.rbegin(); is != split.rend(); is++){ // loop backwards in levels
            double correction = max_weight;
            for(int i=0; i<is->getNumStrips(); i++){
                int idx = new_points.getSlot(std::vector<int>(is->getStrip(i), is->getStrip(i) + num_dimensions));
                refine_weights[idx] += correction;
                max_weight = std::max(max_weight, refine_weights[idx]);
            }
        }
    }

    // compute the weights for the initial points
    std::vector<int> initial_levels = HierarchyManipulations::computeLevels<effrule>(dynamic_values->initial_points);

    std::forward_list<NodeData> weighted_points;
    for(int i=0; i<dynamic_values->initial_points.getNumIndexes(); i++)
        weighted_points.push_front({dynamic_values->initial_points.copyIndex(i), {-1.0 / ((double) initial_levels[i])}});
    for(int i=0; i<new_points.getNumIndexes(); i++)
        weighted_points.push_front({new_points.copyIndex(i), {1.0 / refine_weights[i]}});

    // sort and return the sorted list
    weighted_points.sort([&](const NodeData &a, const NodeData &b)->bool{ return (a.value[0] < b.value[0]); });

    return listToLocalNodes(weighted_points, num_dimensions, [&](int i)->double{ return RuleLocal::getNode<effrule>(i); });
}